

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

FxExpression * __thiscall FxUnaryNotBitwise::Resolve(FxUnaryNotBitwise *this,FCompileContext *ctx)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  FxIntCast *this_00;
  undefined4 extraout_var_00;
  FxConstant *this_01;
  FxExpression *e;
  uint local_30;
  int result;
  FCompileContext *local_20;
  FCompileContext *ctx_local;
  FxUnaryNotBitwise *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    local_20 = ctx;
    ctx_local = (FCompileContext *)this;
    if (this->Operand != (FxExpression *)0x0) {
      iVar1 = (*this->Operand->_vptr_FxExpression[2])(this->Operand,ctx);
      this->Operand = (FxExpression *)CONCAT44(extraout_var,iVar1);
    }
    if (this->Operand == (FxExpression *)0x0) {
      if (this != (FxUnaryNotBitwise *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxUnaryNotBitwise *)0x0;
    }
    else {
      iVar1 = (*(this->Operand->ValueType->super_DObject)._vptr_DObject[0x12])();
      if (iVar1 == 1) {
        this_00 = (FxIntCast *)operator_new(0x40);
        FxIntCast::FxIntCast(this_00,this->Operand);
        this->Operand = (FxExpression *)this_00;
        iVar1 = (*this->Operand->_vptr_FxExpression[2])(this->Operand,local_20);
        this->Operand = (FxExpression *)CONCAT44(extraout_var_00,iVar1);
        if (this->Operand == (FxExpression *)0x0) {
          if (this != (FxUnaryNotBitwise *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          return (FxExpression *)0x0;
        }
      }
      iVar1 = (*(this->Operand->ValueType->super_DObject)._vptr_DObject[0x12])();
      if (iVar1 == 0) {
        uVar2 = (*this->Operand->_vptr_FxExpression[3])();
        if ((uVar2 & 1) == 0) {
          (this->super_FxExpression).ValueType = (PType *)TypeSInt32;
          this_local = this;
        }
        else {
          FxConstant::GetValue((FxConstant *)&e);
          uVar2 = ExpVal::GetInt((ExpVal *)&e);
          ExpVal::~ExpVal((ExpVal *)&e);
          local_30 = ~uVar2;
          this_01 = (FxConstant *)operator_new(0x48);
          FxConstant::FxConstant(this_01,local_30,&(this->super_FxExpression).ScriptPosition);
          this_local = (FxUnaryNotBitwise *)this_01;
          if (this != (FxUnaryNotBitwise *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
        }
      }
      else {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Integer type expected");
        if (this != (FxUnaryNotBitwise *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxUnaryNotBitwise *)0x0;
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxUnaryNotBitwise::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if  (Operand->ValueType->GetRegType() == REGT_FLOAT /* lax */)
	{
		// DECORATE allows floats here so cast them to int.
		Operand = new FxIntCast(Operand);
		Operand = Operand->Resolve(ctx);
		if (Operand == NULL) 
		{
			delete this;
			return NULL;
		}
	}

	if (Operand->ValueType->GetRegType() != REGT_INT)
	{
		ScriptPosition.Message(MSG_ERROR, "Integer type expected");
		delete this;
		return NULL;
	}

	if (Operand->isConstant())
	{
		int result = ~static_cast<FxConstant *>(Operand)->GetValue().GetInt();
		FxExpression *e = new FxConstant(result, ScriptPosition);
		delete this;
		return e;
	}
	ValueType = TypeSInt32;
	return this;
}